

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseTools.cpp
# Opt level: O0

uint64_t siamese::GetTimeMsec(void)

{
  uint64_t uVar1;
  
  uVar1 = GetTimeUsec();
  return uVar1 / 1000;
}

Assistant:

uint64_t GetTimeMsec()
{
#ifdef _WIN32
    LARGE_INTEGER timeStamp = {};
    if (!::QueryPerformanceCounter(&timeStamp))
        return 0;
    if (PerfFrequencyInverseMsec == 0.)
        InitPerfFrequencyInverse();
    return (uint64_t)(PerfFrequencyInverseMsec * timeStamp.QuadPart);
#else
    // TBD: Optimize this?
    return GetTimeUsec() / 1000;
#endif
}